

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall wallet::CWallet::AbandonTransaction(CWallet *this,uint256 *hashTx)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  iVar3 = _GLOBAL__N_1::std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->mapWallet,hashTx);
  if (iVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
      (__node_type *)0x0) {
    __assert_fail("it != mapWallet.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x523,"bool wallet::CWallet::AbandonTransaction(const uint256 &)");
  }
  iVar2 = GetTxDepthInMainChain
                    (this,(CWalletTx *)
                          ((long)iVar3.
                                 super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                 ._M_cur + 0x28));
  if (iVar2 == 0) {
    bVar1 = CWalletTx::InMempool
                      ((CWalletTx *)
                       ((long)iVar3.
                              super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ._M_cur + 0x28));
    if (!bVar1) {
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_40 = std::
                 _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1321:31)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1321:31)>
                 ::_M_manager;
      RecursiveUpdateTxState(this,hashTx,(TryUpdatingStateFn *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      bVar1 = true;
      goto LAB_0052d445;
    }
  }
  bVar1 = false;
LAB_0052d445:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::AbandonTransaction(const uint256& hashTx)
{
    LOCK(cs_wallet);

    // Can't mark abandoned if confirmed or in mempool
    auto it = mapWallet.find(hashTx);
    assert(it != mapWallet.end());
    const CWalletTx& origtx = it->second;
    if (GetTxDepthInMainChain(origtx) != 0 || origtx.InMempool()) {
        return false;
    }

    auto try_updating_state = [](CWalletTx& wtx) EXCLUSIVE_LOCKS_REQUIRED(cs_wallet) {
        // If the orig tx was not in block/mempool, none of its spends can be.
        assert(!wtx.isConfirmed());
        assert(!wtx.InMempool());
        // If already conflicted or abandoned, no need to set abandoned
        if (!wtx.isBlockConflicted() && !wtx.isAbandoned()) {
            wtx.m_state = TxStateInactive{/*abandoned=*/true};
            return TxUpdate::NOTIFY_CHANGED;
        }
        return TxUpdate::UNCHANGED;
    }